

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# framing.c
# Opt level: O1

int ogg_stream_reset(ogg_stream_state *os)

{
  int iVar1;
  
  iVar1 = -1;
  if ((os != (ogg_stream_state *)0x0) && (os->body_data != (uchar *)0x0)) {
    iVar1 = 0;
    os->header_fill = 0;
    os->e_o_s = 0;
    os->b_o_s = 0;
    os->body_fill = 0;
    os->body_returned = 0;
    os->lacing_fill = 0;
    os->lacing_packet = 0;
    os->lacing_returned = 0;
    os->pageno = -1;
    os->packetno = 0;
    os->granulepos = 0;
  }
  return iVar1;
}

Assistant:

int ogg_stream_reset(ogg_stream_state *os){
  if(ogg_stream_check(os)) return -1;

  os->body_fill=0;
  os->body_returned=0;

  os->lacing_fill=0;
  os->lacing_packet=0;
  os->lacing_returned=0;

  os->header_fill=0;

  os->e_o_s=0;
  os->b_o_s=0;
  os->pageno=-1;
  os->packetno=0;
  os->granulepos=0;

  return(0);
}